

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QListWidgetItem * __thiscall QListWidget::takeItem(QListWidget *this,int row)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  QListWidgetPrivate *pQVar4;
  int in_ESI;
  long in_FS_OFFSET;
  QListWidgetPrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  QListWidgetItem *local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QListWidget *)0x89dd79);
  bVar2 = true;
  iVar5 = in_ESI;
  if (-1 < in_ESI) {
    pQVar1 = (pQVar4->super_QListViewPrivate).super_QAbstractItemViewPrivate.model;
    QModelIndex::QModelIndex((QModelIndex *)0x89ddae);
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_20);
    bVar2 = iVar3 <= in_ESI;
  }
  iVar3 = (int)((ulong)pQVar4 >> 0x20);
  if (bVar2) {
    local_28 = (QListWidgetItem *)0x0;
  }
  else {
    QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89ddec);
    local_28 = QListModel::take((QListModel *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem *QListWidget::takeItem(int row)
{
    Q_D(QListWidget);
    if (row < 0 || row >= d->model->rowCount())
        return nullptr;
    return d->listModel()->take(row);
}